

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O1

void __thiscall wabt::BindingHash::FindDuplicates(BindingHash *this,DuplicateCallback *callback)

{
  _Any_data *this_00;
  _Any_data local_48;
  code *local_38;
  undefined1 auStack_28 [8];
  ValueTypeVector duplicates;
  
  if ((this->
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      )._M_h._M_element_count != 0) {
    auStack_28 = (undefined1  [8])0x0;
    duplicates.
    super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    duplicates.
    super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    CreateDuplicatesVector(this,(ValueTypeVector *)auStack_28);
    SortDuplicatesVectorByLocation(this,(ValueTypeVector *)auStack_28);
    this_00 = &local_48;
    std::
    function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
    ::function((function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
                *)this_00,callback);
    CallCallbacks((BindingHash *)this_00,(ValueTypeVector *)auStack_28,
                  (DuplicateCallback *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (auStack_28 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_28);
    }
  }
  return;
}

Assistant:

void BindingHash::FindDuplicates(DuplicateCallback callback) const {
  if (size() > 0) {
    ValueTypeVector duplicates;
    CreateDuplicatesVector(&duplicates);
    SortDuplicatesVectorByLocation(&duplicates);
    CallCallbacks(duplicates, callback);
  }
}